

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QGraphicsItem**>::emplace<QGraphicsItem**&>
          (QPodArrayOps<QGraphicsItem_**> *this,qsizetype i,QGraphicsItem ***args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  QGraphicsItem ***pppQVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QGraphicsItem_**> *in_RDI;
  QGraphicsItem ***where;
  GrowthPosition pos;
  QGraphicsItem **tmp;
  bool detach;
  QArrayDataPointer<QGraphicsItem_**> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  QGraphicsItem **ppQVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<QGraphicsItem_**>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QGraphicsItem_**>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      pppQVar3 = QArrayDataPointer<QGraphicsItem_**>::end(in_RDI);
      *pppQVar3 = (QGraphicsItem **)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QGraphicsItem_**>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      pppQVar3 = QArrayDataPointer<QGraphicsItem_**>::begin
                           ((QArrayDataPointer<QGraphicsItem_**> *)0x9a5aa7);
      pppQVar3[-1] = (QGraphicsItem **)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  ppQVar5 = (QGraphicsItem **)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<QGraphicsItem_**>::detachAndGrow
            ((QArrayDataPointer<QGraphicsItem_**> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)ppQVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (QGraphicsItem ****)in_stack_ffffffffffffffc8,in_RDI);
  pppQVar3 = QPodArrayOps<QGraphicsItem_**>::createHole
                       ((QPodArrayOps<QGraphicsItem_**> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                        (GrowthPosition)((ulong)ppQVar5 >> 0x20),
                        CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                        (qsizetype)in_stack_ffffffffffffffc8);
  *pppQVar3 = ppQVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }